

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O1

int * mbedtls_ssl_list_ciphersuites(void)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  mbedtls_ssl_ciphersuite_t *cur;
  mbedtls_ssl_ciphersuite_t *pmVar5;
  int iVar6;
  
  if (supported_init == '\0') {
    piVar1 = ciphersuite_preference;
    iVar3 = 0xc02c;
    lVar2 = 0;
    piVar4 = supported_ciphersuites;
    do {
      iVar6 = 0xc009;
      pmVar5 = ciphersuite_definitions;
      do {
        if (iVar6 == iVar3) goto LAB_0011738a;
        iVar6 = pmVar5[1].id;
        pmVar5 = pmVar5 + 1;
      } while (iVar6 != 0);
      pmVar5 = (mbedtls_ssl_ciphersuite_t *)0x0;
LAB_0011738a:
      if ((pmVar5 != (mbedtls_ssl_ciphersuite_t *)0x0) &&
         (pmVar5->cipher != MBEDTLS_CIPHER_ARC4_128)) {
        lVar2 = lVar2 + 4;
        *piVar4 = iVar3;
      }
      piVar4 = (int *)((long)supported_ciphersuites + lVar2);
      iVar3 = piVar1[1];
    } while ((iVar3 != 0) && (piVar1 = piVar1 + 1, lVar2 < 0x230));
    *piVar4 = 0;
    supported_init = '\x01';
  }
  return supported_ciphersuites;
}

Assistant:

const int *mbedtls_ssl_list_ciphersuites( void )
{
    /*
     * On initial call filter out all ciphersuites not supported by current
     * build based on presence in the ciphersuite_definitions.
     */
    if( supported_init == 0 )
    {
        const int *p;
        int *q;

        for( p = ciphersuite_preference, q = supported_ciphersuites;
             *p != 0 && q < supported_ciphersuites + MAX_CIPHERSUITES - 1;
             p++ )
        {
#if defined(MBEDTLS_REMOVE_ARC4_CIPHERSUITES)
            const mbedtls_ssl_ciphersuite_t *cs_info;
            if( ( cs_info = mbedtls_ssl_ciphersuite_from_id( *p ) ) != NULL &&
                cs_info->cipher != MBEDTLS_CIPHER_ARC4_128 )
#else
            if( mbedtls_ssl_ciphersuite_from_id( *p ) != NULL )
#endif
                *(q++) = *p;
        }
        *q = 0;

        supported_init = 1;
    }

    return( supported_ciphersuites );
}